

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
pegmatite::AsciiFileInput::fillBuffer(AsciiFileInput *this,Index start,Index *length,char32_t **b)

{
  char32_t *pcVar1;
  ssize_t sVar2;
  Index __nbytes;
  ulong uVar3;
  Index IVar4;
  char buffer [512];
  char local_238 [520];
  
  if (this->file_size < start) {
    return false;
  }
  uVar3 = 0x200;
  if (*length < 0x200) {
    uVar3 = *length;
  }
  *length = uVar3;
  __nbytes = this->file_size - start;
  if (uVar3 <= __nbytes) {
    __nbytes = uVar3;
  }
  *length = __nbytes;
  uVar3 = __nbytes;
  do {
    sVar2 = pread(this->fd,local_238,__nbytes,start);
    if (sVar2 < 1) {
      return 0 < sVar2;
    }
    __nbytes = *length;
    uVar3 = uVar3 - __nbytes;
  } while (uVar3 != 0);
  pcVar1 = *b;
  for (IVar4 = 0; __nbytes != IVar4; IVar4 = IVar4 + 1) {
    pcVar1[IVar4] = (int)local_238[IVar4];
  }
  return 0 < sVar2;
}

Assistant:

bool AsciiFileInput::fillBuffer(Index start, Index &length, char32_t *&b)
{
	if (start > file_size)
	{
		return false;
	}
	char buffer[static_buffer_size];
	// This should be a no-op
	length = std::min(length, static_buffer_size);
	length = std::min(length, file_size - start);
	Index bytes_to_read = length;
	do {
		ssize_t ret = pread(fd, buffer, length,
		                    static_cast<off_t>(start));
		if (ret < 1)
		{
			return false;
		}
		bytes_to_read -= length;
	} while (bytes_to_read > 0);
	for (Index i=0 ; i<length ; i++)
	{
		b[i] = static_cast<char32_t>(buffer[i]);
	}
	return true;
}